

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_barrier.cpp
# Opt level: O0

void __thiscall SharedBarrier::SharedBarrier(SharedBarrier *this,uint32_t count)

{
  __pid_t _Var1;
  unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  local_20;
  uint32_t local_14;
  SharedBarrier *pSStack_10;
  uint32_t count_local;
  SharedBarrier *this_local;
  
  local_14 = count;
  pSStack_10 = this;
  std::
  unique_ptr<SharedMemoryObject<pthread_barrier_t>,std::default_delete<SharedMemoryObject<pthread_barrier_t>>>
  ::unique_ptr<std::default_delete<SharedMemoryObject<pthread_barrier_t>>,void>
            ((unique_ptr<SharedMemoryObject<pthread_barrier_t>,std::default_delete<SharedMemoryObject<pthread_barrier_t>>>
              *)this);
  std::make_unique<SharedMemoryObject<pthread_barrier_t>>();
  std::
  unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ::operator=(&this->barrier_,&local_20);
  std::
  unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ::~unique_ptr(&local_20);
  init(this,(EVP_PKEY_CTX *)(ulong)local_14);
  _Var1 = getpid();
  this->owner_pid_ = _Var1;
  return;
}

Assistant:

SharedBarrier::SharedBarrier(uint32_t count) {
    barrier_ = std::make_unique<SharedMemoryObject<pthread_barrier_t>>();
    init(count);
    owner_pid_ = getpid();
}